

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo
               (SnapObject *snpObject,FileWriter *writer)

{
  SnapBoundFunctionInfo *pSVar1;
  uint local_24;
  uint32 i;
  SnapBoundFunctionInfo *snapBoundInfo;
  FileWriter *writer_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapBoundFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)8>
                     (snpObject);
  FileWriter::WriteAddr(writer,boundFunction,pSVar1->TargetFunction,CommaAndBigSpaceSeparator);
  FileWriter::WriteAddr(writer,boundThis,pSVar1->BoundThis,CommaSeparator);
  FileWriter::WriteLengthValue(writer,pSVar1->ArgCount,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x46,3);
  (*writer->_vptr_FileWriter[4])(writer,0);
  for (local_24 = 0; local_24 < pSVar1->ArgCount; local_24 = local_24 + 1) {
    NSSnapValues::EmitTTDVar(pSVar1->ArgArray[local_24],writer,local_24 != 0);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  return;
}

Assistant:

void EmitAddtlInfo_SnapBoundFunctionInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapBoundFunctionInfo* snapBoundInfo = SnapObjectGetAddtlInfoAs<SnapBoundFunctionInfo*, SnapObjectType::SnapBoundFunctionObject>(snpObject);

            writer->WriteAddr(NSTokens::Key::boundFunction, snapBoundInfo->TargetFunction, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteAddr(NSTokens::Key::boundThis, snapBoundInfo->BoundThis, NSTokens::Separator::CommaSeparator);
            writer->WriteLengthValue(snapBoundInfo->ArgCount, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::boundArgs, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart();
            for(uint32 i = 0; i < snapBoundInfo->ArgCount; ++i)
            {
                NSSnapValues::EmitTTDVar(snapBoundInfo->ArgArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();
        }